

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BitstreamEncoder.cpp
# Opt level: O1

bool generate_special(TrackData *trackdata)

{
  bool bVar1;
  Track *pTVar2;
  int weak_size;
  int weak_offset;
  Track track;
  int local_f8;
  int local_f4;
  Track local_f0;
  TrackData local_d0;
  
  pTVar2 = TrackData::track(trackdata);
  local_f0.tracklen = pTVar2->tracklen;
  local_f0.tracktime = pTVar2->tracktime;
  std::vector<Sector,_std::allocator<Sector>_>::vector(&local_f0.m_sectors,&pTVar2->m_sectors);
  local_f4 = 0;
  local_f8 = 0;
  bVar1 = IsEmptyTrack(&local_f0);
  if (bVar1) {
    GenerateEmptyTrack(&local_d0,&trackdata->cylhead,&local_f0);
    TrackData::add(trackdata,&local_d0);
LAB_001422fe:
    std::
    vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
    ::~vector(&local_d0.m_flux);
    if (local_d0.m_bitstream.m_sync_losses.super__Vector_base<int,_std::allocator<int>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_d0.m_bitstream.m_sync_losses.
                      super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
                      _M_start,(long)local_d0.m_bitstream.m_sync_losses.
                                     super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                     super__Vector_impl_data._M_end_of_storage -
                               (long)local_d0.m_bitstream.m_sync_losses.
                                     super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                     super__Vector_impl_data._M_start);
    }
    if (local_d0.m_bitstream.m_indexes.super__Vector_base<int,_std::allocator<int>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_d0.m_bitstream.m_indexes.super__Vector_base<int,_std::allocator<int>_>.
                      _M_impl.super__Vector_impl_data._M_start,
                      (long)local_d0.m_bitstream.m_indexes.
                            super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage -
                      (long)local_d0.m_bitstream.m_indexes.
                            super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_start);
    }
    if (local_d0.m_bitstream.m_data.
        super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_d0.m_bitstream.m_data.
                      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                      super__Vector_impl_data._M_start,
                      (long)local_d0.m_bitstream.m_data.
                            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                            _M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)local_d0.m_bitstream.m_data.
                            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                            _M_impl.super__Vector_impl_data._M_start);
    }
    std::vector<Sector,_std::allocator<Sector>_>::~vector(&local_d0.m_track.m_sectors);
  }
  else {
    bVar1 = IsKBI19Track(&local_f0);
    if (bVar1) {
      GenerateKBI19Track(&local_d0,&trackdata->cylhead,&local_f0);
      TrackData::add(trackdata,&local_d0);
      goto LAB_001422fe;
    }
    bVar1 = IsSystem24Track(&local_f0);
    if (bVar1) {
      GenerateSystem24Track(&local_d0,&trackdata->cylhead,&local_f0);
      TrackData::add(trackdata,&local_d0);
      goto LAB_001422fe;
    }
    bVar1 = IsSpectrumSpeedlockTrack(&local_f0,&local_f4,&local_f8);
    if (bVar1) {
      GenerateSpectrumSpeedlockTrack(&local_d0,&trackdata->cylhead,&local_f0,local_f4,local_f8);
      TrackData::add(trackdata,&local_d0);
      goto LAB_001422fe;
    }
    bVar1 = IsCpcSpeedlockTrack(&local_f0,&local_f4,&local_f8);
    if (bVar1) {
      GenerateCpcSpeedlockTrack(&local_d0,&trackdata->cylhead,&local_f0,local_f4,local_f8);
      TrackData::add(trackdata,&local_d0);
      goto LAB_001422fe;
    }
    bVar1 = IsRainbowArtsTrack(&local_f0,&local_f4,&local_f8);
    if (bVar1) {
      GenerateRainbowArtsTrack(&local_d0,&trackdata->cylhead,&local_f0,local_f4,local_f8);
      TrackData::add(trackdata,&local_d0);
    }
    else {
      bVar1 = IsKBIWeakSectorTrack(&local_f0,&local_f4,&local_f8);
      if (bVar1) {
        GenerateKBIWeakSectorTrack(&local_d0,&trackdata->cylhead,&local_f0,local_f4,local_f8);
        TrackData::add(trackdata,&local_d0);
      }
      else {
        bVar1 = IsLogoProfTrack(&local_f0);
        if (bVar1) {
          GenerateLogoProfTrack(&local_d0,&trackdata->cylhead,&local_f0);
          TrackData::add(trackdata,&local_d0);
        }
        else {
          bVar1 = IsOperaSoftTrack(&local_f0);
          if (bVar1) {
            GenerateOperaSoftTrack(&local_d0,&trackdata->cylhead,&local_f0);
            TrackData::add(trackdata,&local_d0);
          }
          else {
            bVar1 = Is8KSectorTrack(&local_f0);
            if (bVar1) {
              Generate8KSectorTrack(&local_d0,&trackdata->cylhead,&local_f0);
              TrackData::add(trackdata,&local_d0);
            }
            else {
              bVar1 = Is11SectorTrack(&local_f0);
              if (!bVar1) {
                bVar1 = false;
                goto LAB_00142365;
              }
              Generate11SectorTrack(&local_d0,&trackdata->cylhead,&local_f0);
              TrackData::add(trackdata,&local_d0);
            }
          }
        }
      }
    }
    TrackData::~TrackData(&local_d0);
  }
  bVar1 = true;
LAB_00142365:
  std::vector<Sector,_std::allocator<Sector>_>::~vector(&local_f0.m_sectors);
  return bVar1;
}

Assistant:

bool generate_special(TrackData& trackdata)
{
    auto track{ trackdata.track() };
    int weak_offset{ 0 }, weak_size{ 0 };

    // Special formats have special conversions
    if (IsEmptyTrack(track))
        trackdata.add(GenerateEmptyTrack(trackdata.cylhead, track));
    else if (IsKBI19Track(track))
        trackdata.add(GenerateKBI19Track(trackdata.cylhead, track));
    else if (IsSystem24Track(track))
        trackdata.add(GenerateSystem24Track(trackdata.cylhead, track));
    else if (IsSpectrumSpeedlockTrack(track, weak_offset, weak_size))
        trackdata.add(GenerateSpectrumSpeedlockTrack(trackdata.cylhead, track, weak_offset, weak_size));
    else if (IsCpcSpeedlockTrack(track, weak_offset, weak_size))
        trackdata.add(GenerateCpcSpeedlockTrack(trackdata.cylhead, track, weak_offset, weak_size));
    else if (IsRainbowArtsTrack(track, weak_offset, weak_size))
        trackdata.add(GenerateRainbowArtsTrack(trackdata.cylhead, track, weak_offset, weak_size));
    else if (IsKBIWeakSectorTrack(track, weak_offset, weak_size))
        trackdata.add(GenerateKBIWeakSectorTrack(trackdata.cylhead, track, weak_offset, weak_size));
    else if (IsLogoProfTrack(track))
        trackdata.add(GenerateLogoProfTrack(trackdata.cylhead, track));
    else if (IsOperaSoftTrack(track))
        trackdata.add(GenerateOperaSoftTrack(trackdata.cylhead, track));
    else if (Is8KSectorTrack(track))
        trackdata.add(Generate8KSectorTrack(trackdata.cylhead, track));
    else if (Is11SectorTrack(track))
        trackdata.add(Generate11SectorTrack(trackdata.cylhead, track));
    else
        return false;

    return true;
}